

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ImGuiID id;
  ImU32 col;
  ImGuiWindow *pIVar9;
  uint uVar10;
  ImGuiContext *g;
  ImDrawCornerFlags rounding_corners;
  undefined1 auVar11 [16];
  float fVar12;
  undefined4 extraout_XMM0_Db;
  ImVec2 IVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ulong extraout_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 in_register_00001384 [12];
  ImRect IVar26;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  bool local_101;
  float local_100;
  bool local_f9;
  ImRect local_f8;
  uint local_dc;
  undefined1 local_d8 [16];
  ImVec2 local_c8 [2];
  ImU32 local_b8;
  uint local_b4;
  ImVec2 local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  ulong uStack_80;
  char *local_70;
  char *local_68;
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  ImRect local_40;
  undefined1 extraout_var_00 [56];
  undefined1 auVar20 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar22 [56];
  
  pIVar4 = GImGui;
  local_b4 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = local_b4 & 0xffffffef;
  pIVar9 = pIVar4->CurrentWindow;
  pIVar9->WriteAccessed = true;
  if (pIVar9->SkipItems != false) {
    return false;
  }
  local_68 = preview_value;
  id = ImGuiWindow::GetID(pIVar9,label,(char *)0x0);
  local_a8 = 0.0;
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0;
  if ((flags & 0x20U) == 0) {
    local_a8 = GetFrameHeight();
    uStack_a4 = extraout_XMM0_Db;
    uStack_a0 = extraout_XMM0_Dc;
    uStack_9c = extraout_XMM0_Dd;
  }
  local_70 = label;
  IVar13 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88 = IVar13.x;
  fStack_84 = IVar13.y;
  uStack_80 = extraout_XMM0_Qb;
  fVar12 = CalcItemWidth();
  uVar10 = (flags & 0x40U) >> 6;
  bVar8 = SUB41(uVar10,0);
  local_98._0_4_ = uVar10 * (int)local_a8 + (uint)!bVar8 * (int)fVar12;
  local_98._4_12_ = extraout_var;
  auVar1._4_4_ = fStack_84;
  auVar1._0_4_ = local_88;
  auVar1._8_8_ = uStack_80;
  auVar1 = vmovshdup_avx(auVar1);
  fVar12 = (pIVar4->Style).FramePadding.y;
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar12),ZEXT416(0x40000000));
  IVar13 = (pIVar9->DC).CursorPos;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = IVar13.x;
  auVar11._4_4_ = IVar13.y;
  auVar1 = vinsertps_avx(local_98,auVar1,0x10);
  auVar23._0_4_ = auVar1._0_4_ + IVar13.x;
  auVar23._4_4_ = auVar1._4_4_ + IVar13.y;
  auVar23._8_4_ = auVar1._8_4_ + 0.0;
  auVar23._12_4_ = auVar1._12_4_ + 0.0;
  local_f8 = (ImRect)vmovlhps_avx(auVar11,auVar23);
  fVar25 = 0.0;
  if (0.0 < local_88) {
    fVar25 = local_88 + (pIVar4->Style).ItemInnerSpacing.x;
  }
  auVar24._0_4_ = fVar25 + local_f8.Max.x;
  auVar24._4_4_ = local_f8.Max.y + 0.0;
  auVar24._8_8_ = 0;
  local_40 = (ImRect)vmovlhps_avx(auVar11,auVar24);
  local_dc = flags;
  ItemSize(&local_40,fVar12);
  bVar5 = ItemAdd(&local_40,id,&local_f8);
  if (!bVar5) {
    return false;
  }
  bVar6 = ButtonBehavior(&local_f8,id,&local_101,&local_f9,0);
  bVar7 = IsPopupOpen(id);
  local_b8 = GetColorU32(local_101 + 7,1.0);
  local_d8 = ZEXT416((uint)local_f8.Min.x);
  local_100 = local_f8.Max.x;
  RenderNavHighlight(&local_f8,id,1);
  uVar10 = local_dc;
  uVar2 = vcmpss_avx512f(ZEXT416((uint)(local_100 - local_a8)),local_d8,2);
  bVar5 = (bool)((byte)uVar2 & 1);
  fVar12 = (float)((uint)bVar5 * local_d8._0_4_ + (uint)!bVar5 * (int)(local_100 - local_a8));
  local_d8 = ZEXT416((uint)fVar12);
  if ((local_dc & 0x40) == 0) {
    local_c8[0].y = local_f8.Max.y;
    local_c8[0].x = fVar12;
    rounding_corners = 0xf;
    if ((local_dc & 0x20) == 0) {
      rounding_corners = 5;
    }
    ImDrawList::AddRectFilled
              (pIVar9->DrawList,&local_f8.Min,local_c8,local_b8,(pIVar4->Style).FrameRounding,
               rounding_corners);
  }
  if ((uVar10 & 0x20) == 0) {
    col = GetColorU32(((byte)(local_101 | bVar7) & 1) + 0x15,1.0);
    local_100 = (float)GetColorU32(0,1.0);
    local_c8[0].y = local_f8.Min.y;
    local_c8[0].x = (float)local_d8._0_4_;
    ImDrawList::AddRectFilled
              (pIVar9->DrawList,local_c8,&local_f8.Max,col,(pIVar4->Style).FrameRounding,
               (uint)((float)local_98._0_4_ <= local_a8) * 5 + 10);
    uVar10 = local_dc;
    if (((float)local_d8._0_4_ + local_a8) - (pIVar4->Style).FramePadding.x <= local_f8.Max.x) {
      fVar12 = (pIVar4->Style).FramePadding.y;
      auVar1 = vinsertps_avx(ZEXT416((uint)(fVar12 + (float)local_d8._0_4_)),
                             ZEXT416((uint)(fVar12 + local_f8.Min.y)),0x10);
      RenderArrow(pIVar9->DrawList,auVar1._0_8_,(ImU32)local_100,3,1.0);
    }
  }
  RenderFrameBorder(local_f8.Min,local_f8.Max,(pIVar4->Style).FrameRounding);
  if (local_68 != (char *)0x0 && bVar8 == false) {
    IVar13 = (pIVar4->Style).FramePadding;
    auVar14._0_4_ = local_f8.Min.x + IVar13.x;
    auVar14._4_4_ = local_f8.Min.y + IVar13.y;
    auVar14._8_8_ = 0;
    local_c8[0] = (ImVec2)vmovlps_avx(auVar14);
    local_58.Min.y = local_f8.Max.y;
    local_58.Min.x = (float)local_d8._0_4_;
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    RenderTextClipped(local_c8,&local_58.Min,local_68,(char *)0x0,(ImVec2 *)0x0,&local_b0,
                      (ImRect *)0x0);
  }
  IVar26 = local_f8;
  auVar22 = ZEXT856(uStack_80);
  if (0.0 < local_88) {
    auVar15._8_8_ = 0;
    auVar15._0_4_ = local_f8.Min.y;
    auVar15._4_4_ = local_f8.Max.x;
    auVar22 = (undefined1  [56])0x0;
    auVar11 = vpermi2ps_avx512vl(_DAT_0029f290,ZEXT416((uint)(pIVar4->Style).FramePadding.y),
                                 ZEXT416((uint)(pIVar4->Style).ItemInnerSpacing.x));
    auVar1 = vshufps_avx(auVar15,auVar15,0xe1);
    IVar13.x = auVar1._0_4_ + auVar11._0_4_;
    IVar13.y = auVar1._4_4_ + auVar11._4_4_;
    local_f8 = IVar26;
    RenderText(IVar13,local_70,(char *)0x0,true);
  }
  if (bVar6) {
    if (bVar7) goto LAB_00253f87;
  }
  else if (pIVar4->NavActivateId != id || bVar7) {
    if (!bVar7) {
      return false;
    }
    goto LAB_00253f87;
  }
  if ((pIVar9->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
    pIVar9->NavLastIds[0] = id;
  }
  OpenPopupEx(id);
LAB_00253f87:
  if ((local_b4 & 0x10) == 0) {
    uVar3 = uVar10 | 4;
    if ((uVar10 & 0x1e) != 0) {
      uVar3 = uVar10;
    }
    uVar10 = 8;
    if (((uVar3 & 4) == 0) && (uVar10 = 4, (uVar3 & 2) == 0)) {
      uVar10 = -(uint)((uVar3 & 8) == 0) | 0x14;
    }
    local_c8[0].y = 0.0;
    local_c8[0].x = (float)local_98._0_4_;
    if ((int)uVar10 < 1) {
      fVar12 = 3.4028235e+38;
    }
    else {
      auVar22 = (undefined1  [56])0x0;
      fVar12 = (GImGui->Style).ItemSpacing.y;
      auVar16._0_4_ = (float)(int)uVar10;
      auVar16._4_12_ = in_register_00001384;
      auVar1 = vfmsub213ss_fma(auVar16,ZEXT416((uint)(fVar12 + GImGui->FontSize)),
                               ZEXT416((uint)fVar12));
      auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)(GImGui->Style).WindowPadding.y),
                               ZEXT416(0x40000000));
      fVar12 = auVar1._0_4_;
    }
    local_58.Min.y = fVar12;
    local_58.Min.x = 3.4028235e+38;
    SetNextWindowSizeConstraints(local_c8,&local_58.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
    uVar10 = uVar3;
  }
  else {
    *(byte *)&(pIVar4->NextWindowData).Flags = (byte)(pIVar4->NextWindowData).Flags | 0x10;
    fVar12 = (pIVar4->NextWindowData).SizeConstraintRect.Min.x;
    uVar2 = vcmpss_avx512f(local_98,ZEXT416((uint)fVar12),2);
    bVar8 = (bool)((byte)uVar2 & 1);
    auVar22 = ZEXT856(local_98._8_8_);
    (pIVar4->NextWindowData).SizeConstraintRect.Min.x =
         (float)((uint)bVar8 * (int)fVar12 + (uint)!bVar8 * local_98._0_4_);
  }
  ImFormatString((char *)local_c8,0x10,"##Combo_%02d",(ulong)(uint)(pIVar4->BeginPopupStack).Size);
  pIVar9 = FindWindowByName((char *)local_c8);
  if ((pIVar9 != (ImGuiWindow *)0x0) && (pIVar9->WasActive == true)) {
    auVar17._0_8_ = CalcWindowExpectedSize(pIVar9);
    auVar17._8_56_ = extraout_var_00;
    local_b0 = (ImVec2)vmovlps_avx(auVar17._0_16_);
    if ((uVar10 & 1) != 0) {
      pIVar9->AutoPosLastDirection = 0;
    }
    auVar20 = extraout_var_00;
    IVar26 = GetWindowAllowedExtentRect(pIVar9);
    auVar21._0_8_ = IVar26.Max;
    auVar21._8_56_ = auVar22;
    auVar18._0_8_ = IVar26.Min;
    auVar18._8_56_ = auVar20;
    local_58 = (ImRect)vmovlhps_avx(auVar18._0_16_,auVar21._0_16_);
    auVar1 = vinsertps_avx((undefined1  [16])local_f8,ZEXT416((uint)local_f8.Max.y),0x10);
    local_60 = (ImVec2)vmovlps_avx(auVar1);
    auVar19._0_8_ =
         FindBestWindowPosForPopupEx
                   (&local_60,&local_b0,&pIVar9->AutoPosLastDirection,&local_58,&local_f8,
                    ImGuiPopupPositionPolicy_ComboBox);
    auVar19._8_56_ = extraout_var_01;
    local_48 = (ImVec2)vmovlps_avx(auVar19._0_16_);
    local_60.x = 0.0;
    local_60.y = 0.0;
    SetNextWindowPos(&local_48,0,&local_60);
  }
  local_58.Min.y = (pIVar4->Style).WindowPadding.y;
  local_58.Min.x = (pIVar4->Style).FramePadding.x;
  PushStyleVar(1,&local_58.Min);
  bVar8 = Begin((char *)local_c8,(bool *)0x0,0x4000147);
  PopStyleVar(1);
  if (!bVar8) {
    EndPopup();
    return bVar8;
  }
  return bVar8;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}